

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall OpenMD::NonNegativeConstraint::NonNegativeConstraint(NonNegativeConstraint *this)

{
  string *in_RDI;
  
  ParamConstraintFacade<OpenMD::NonNegativeConstraint>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)0x29e378);
  std::__cxx11::string::operator=(in_RDI,"nonnegative");
  return;
}

Assistant:

NonNegativeConstraint() { this->description_ = "nonnegative"; }